

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowExampleAppConstrainedResize(bool *p_open)

{
  bool bVar1;
  int local_f0;
  int i;
  ImVec2 local_e4;
  ImVec2 local_dc;
  ImVec2 local_d4;
  ImVec2 local_cc;
  ImVec2 local_c4;
  ImGuiWindowFlags local_bc;
  ImGuiWindowFlags flags;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  char *local_48;
  char *test_desc [7];
  bool *p_open_local;
  
  test_desc[6] = p_open;
  memcpy(&local_48,&PTR_anon_var_dwarf_b7d19_00261bd0,0x38);
  if (ShowExampleAppConstrainedResize::type == 0) {
    ImVec2::ImVec2(&local_50,-1.0,0.0);
    ImVec2::ImVec2(&local_58,-1.0,3.4028235e+38);
    ImGui::SetNextWindowSizeConstraints(&local_50,&local_58,(ImGuiSizeCallback)0x0,(void *)0x0);
  }
  if (ShowExampleAppConstrainedResize::type == 1) {
    ImVec2::ImVec2(&local_60,0.0,-1.0);
    ImVec2::ImVec2(&local_68,3.4028235e+38,-1.0);
    ImGui::SetNextWindowSizeConstraints(&local_60,&local_68,(ImGuiSizeCallback)0x0,(void *)0x0);
  }
  if (ShowExampleAppConstrainedResize::type == 2) {
    ImVec2::ImVec2(&local_70,100.0,100.0);
    ImVec2::ImVec2(&local_78,3.4028235e+38,3.4028235e+38);
    ImGui::SetNextWindowSizeConstraints(&local_70,&local_78,(ImGuiSizeCallback)0x0,(void *)0x0);
  }
  if (ShowExampleAppConstrainedResize::type == 3) {
    ImVec2::ImVec2(&local_80,400.0,-1.0);
    ImVec2::ImVec2(&local_88,500.0,-1.0);
    ImGui::SetNextWindowSizeConstraints(&local_80,&local_88,(ImGuiSizeCallback)0x0,(void *)0x0);
  }
  if (ShowExampleAppConstrainedResize::type == 4) {
    ImVec2::ImVec2(&local_90,-1.0,400.0);
    ImVec2::ImVec2(&local_98,-1.0,500.0);
    ImGui::SetNextWindowSizeConstraints(&local_90,&local_98,(ImGuiSizeCallback)0x0,(void *)0x0);
  }
  if (ShowExampleAppConstrainedResize::type == 5) {
    ImVec2::ImVec2(&local_a0,0.0,0.0);
    ImVec2::ImVec2(&local_a8,3.4028235e+38,3.4028235e+38);
    ImGui::SetNextWindowSizeConstraints
              (&local_a0,&local_a8,ShowExampleAppConstrainedResize::CustomConstraints::Square,
               (void *)0x0);
  }
  if (ShowExampleAppConstrainedResize::type == 6) {
    ImVec2::ImVec2(&local_b0,0.0,0.0);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff48,3.4028235e+38,3.4028235e+38);
    ImGui::SetNextWindowSizeConstraints
              (&local_b0,(ImVec2 *)&stack0xffffffffffffff48,
               ShowExampleAppConstrainedResize::CustomConstraints::Step,(void *)0x64);
  }
  local_bc = 0;
  if ((ShowExampleAppConstrainedResize::auto_resize & 1U) != 0) {
    local_bc = 0x40;
  }
  bVar1 = ImGui::Begin("Example: Constrained Resize",(bool *)test_desc[6],local_bc);
  if (bVar1) {
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_demo.cpp"
                 ,0x1c80,"Examples/Constrained Resizing window",GImGuiDemoMarkerCallbackUserData);
    }
    ImVec2::ImVec2(&local_c4,0.0,0.0);
    bVar1 = ImGui::Button("200x200",&local_c4);
    if (bVar1) {
      ImVec2::ImVec2(&local_cc,200.0,200.0);
      ImGui::SetWindowSize(&local_cc,0);
    }
    ImGui::SameLine(0.0,-1.0);
    ImVec2::ImVec2(&local_d4,0.0,0.0);
    bVar1 = ImGui::Button("500x500",&local_d4);
    if (bVar1) {
      ImVec2::ImVec2(&local_dc,500.0,500.0);
      ImGui::SetWindowSize(&local_dc,0);
    }
    ImGui::SameLine(0.0,-1.0);
    ImVec2::ImVec2(&local_e4,0.0,0.0);
    bVar1 = ImGui::Button("800x200",&local_e4);
    if (bVar1) {
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff14,800.0,200.0);
      ImGui::SetWindowSize((ImVec2 *)&stack0xffffffffffffff14,0);
    }
    ImGui::SetNextItemWidth(200.0);
    ImGui::Combo("Constraint",&ShowExampleAppConstrainedResize::type,&local_48,7,-1);
    ImGui::SetNextItemWidth(200.0);
    ImGui::DragInt("Lines",&ShowExampleAppConstrainedResize::display_lines,0.2,1,100,"%d",0);
    ImGui::Checkbox("Auto-resize",&ShowExampleAppConstrainedResize::auto_resize);
    for (local_f0 = 0; local_f0 < ShowExampleAppConstrainedResize::display_lines;
        local_f0 = local_f0 + 1) {
      ImGui::Text("%*sHello, sailor! Making this line long enough for the example.",
                  (ulong)(uint)(local_f0 << 2),"");
    }
  }
  ImGui::End();
  return;
}

Assistant:

static void ShowExampleAppConstrainedResize(bool* p_open)
{
    struct CustomConstraints
    {
        // Helper functions to demonstrate programmatic constraints
        static void Square(ImGuiSizeCallbackData* data) { data->DesiredSize.x = data->DesiredSize.y = IM_MAX(data->DesiredSize.x, data->DesiredSize.y); }
        static void Step(ImGuiSizeCallbackData* data)   { float step = (float)(int)(intptr_t)data->UserData; data->DesiredSize = ImVec2((int)(data->DesiredSize.x / step + 0.5f) * step, (int)(data->DesiredSize.y / step + 0.5f) * step); }
    };

    const char* test_desc[] =
    {
        "Resize vertical only",
        "Resize horizontal only",
        "Width > 100, Height > 100",
        "Width 400-500",
        "Height 400-500",
        "Custom: Always Square",
        "Custom: Fixed Steps (100)",
    };

    static bool auto_resize = false;
    static int type = 0;
    static int display_lines = 10;
    if (type == 0) ImGui::SetNextWindowSizeConstraints(ImVec2(-1, 0),    ImVec2(-1, FLT_MAX));      // Vertical only
    if (type == 1) ImGui::SetNextWindowSizeConstraints(ImVec2(0, -1),    ImVec2(FLT_MAX, -1));      // Horizontal only
    if (type == 2) ImGui::SetNextWindowSizeConstraints(ImVec2(100, 100), ImVec2(FLT_MAX, FLT_MAX)); // Width > 100, Height > 100
    if (type == 3) ImGui::SetNextWindowSizeConstraints(ImVec2(400, -1),  ImVec2(500, -1));          // Width 400-500
    if (type == 4) ImGui::SetNextWindowSizeConstraints(ImVec2(-1, 400),  ImVec2(-1, 500));          // Height 400-500
    if (type == 5) ImGui::SetNextWindowSizeConstraints(ImVec2(0, 0),     ImVec2(FLT_MAX, FLT_MAX), CustomConstraints::Square);                     // Always Square
    if (type == 6) ImGui::SetNextWindowSizeConstraints(ImVec2(0, 0),     ImVec2(FLT_MAX, FLT_MAX), CustomConstraints::Step, (void*)(intptr_t)100); // Fixed Step

    ImGuiWindowFlags flags = auto_resize ? ImGuiWindowFlags_AlwaysAutoResize : 0;
    if (ImGui::Begin("Example: Constrained Resize", p_open, flags))
    {
        IMGUI_DEMO_MARKER("Examples/Constrained Resizing window");
        if (ImGui::Button("200x200")) { ImGui::SetWindowSize(ImVec2(200, 200)); } ImGui::SameLine();
        if (ImGui::Button("500x500")) { ImGui::SetWindowSize(ImVec2(500, 500)); } ImGui::SameLine();
        if (ImGui::Button("800x200")) { ImGui::SetWindowSize(ImVec2(800, 200)); }
        ImGui::SetNextItemWidth(200);
        ImGui::Combo("Constraint", &type, test_desc, IM_ARRAYSIZE(test_desc));
        ImGui::SetNextItemWidth(200);
        ImGui::DragInt("Lines", &display_lines, 0.2f, 1, 100);
        ImGui::Checkbox("Auto-resize", &auto_resize);
        for (int i = 0; i < display_lines; i++)
            ImGui::Text("%*sHello, sailor! Making this line long enough for the example.", i * 4, "");
    }
    ImGui::End();
}